

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O1

void util::PrintLines(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *arr,bool force_output)

{
  pointer pbVar1;
  pointer pcVar2;
  pointer pbVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  long *local_50;
  long local_48;
  long local_40 [2];
  
  if (force_output || is_visualizing_) {
    pbVar3 = (arr->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pbVar1 = (arr->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if (pbVar3 != pbVar1) {
      do {
        pcVar2 = (pbVar3->_M_dataplus)._M_p;
        local_50 = local_40;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_50,pcVar2,pcVar2 + pbVar3->_M_string_length);
        std::__cxx11::string::append((char *)&local_50);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,(char *)local_50,local_48);
        if (local_50 != local_40) {
          operator_delete(local_50,local_40[0] + 1);
        }
        pbVar3 = pbVar3 + 1;
      } while (pbVar3 != pbVar1);
    }
  }
  return;
}

Assistant:

void util::PrintLines(vector<string> & arr, bool force_output) {

	if (!is_visualizing_ && !force_output) return;

	for (auto &i : arr) {
		cout << i + "\n";
	}
}